

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

string * __thiscall
google::SetCommandLineOptionWithMode_abi_cxx11_
          (string *__return_storage_ptr__,google *this,char *name,char *value,
          FlagSettingMode set_mode)

{
  FlagRegistry *this_00;
  CommandLineFlag *flag;
  CommandLineFlagParser parser;
  string sStack_b8;
  CommandLineFlagParser local_98;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this_00 = anon_unknown_1::FlagRegistry::GlobalRegistry();
  gflags_mutex_namespace::Mutex::Lock(&this_00->lock_);
  flag = anon_unknown_1::FlagRegistry::FindFlagLocked(this_00,(char *)this);
  if (flag != (CommandLineFlag *)0x0) {
    local_98.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header;
    local_98.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98.error_flags_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header;
    local_98.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    local_98.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98.registry_ = this_00;
    local_98.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_98.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    (anonymous_namespace)::CommandLineFlagParser::ProcessSingleOptionLocked_abi_cxx11_
              (&sStack_b8,&local_98,flag,name,(FlagSettingMode)value);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_b8);
    std::__cxx11::string::~string((string *)&sStack_b8);
    anon_unknown_1::CommandLineFlagParser::~CommandLineFlagParser(&local_98);
  }
  gflags_mutex_namespace::Mutex::Unlock(&this_00->lock_);
  return __return_storage_ptr__;
}

Assistant:

string SetCommandLineOptionWithMode(const char* name, const char* value,
                                    FlagSettingMode set_mode) {
  string result;
  FlagRegistry* const registry = FlagRegistry::GlobalRegistry();
  FlagRegistryLock frl(registry);
  CommandLineFlag* flag = registry->FindFlagLocked(name);
  if (flag) {
    CommandLineFlagParser parser(registry);
    result = parser.ProcessSingleOptionLocked(flag, value, set_mode);
    if (!result.empty()) {   // in the error case, we've already logged
      // Could consider logging this change
    }
  }
  // The API of this function is that we return empty string on error
  return result;
}